

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_ext32s_i64_riscv64(TCGContext_conflict11 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg)

{
  TCGv_i64 arg_local;
  TCGv_i64 ret_local;
  TCGContext_conflict11 *tcg_ctx_local;
  
  tcg_gen_op2_i64(tcg_ctx,INDEX_op_ext32s_i64,ret,arg);
  return;
}

Assistant:

void tcg_gen_ext32s_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_mov_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg));
        tcg_gen_sari_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_LOW(tcg_ctx, ret), 31);
#elif TCG_TARGET_HAS_ext32s_i64
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_ext32s_i64, ret, arg);
#else
        tcg_gen_shli_i64(tcg_ctx, ret, arg, 32);
        tcg_gen_sari_i64(tcg_ctx, ret, ret, 32);
#endif
}